

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
dlib::
add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
::add_layer(add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
            *this)

{
  add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void> *paVar1;
  undefined1 auVar2 [16];
  storage_heap sVar3;
  
  con_<64L,_1L,_1L,_1,_1,_0,_0>::con_(&this->details,(num_con_outputs)0x40);
  paVar1 = (add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void> *)operator_new(0x148);
  auVar2 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])((long)&(paVar1->cached_output).super_tensor + 8) = ZEXT1632(auVar2);
  *(longlong *)((long)&(paVar1->cached_output).super_tensor + 0x28) = 0;
  (paVar1->cached_output).data_instance.data_size = 0;
  (paVar1->cached_output).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  *(undefined4 *)((long)&(paVar1->cached_output).data_instance + 8) = 0x101;
  *(undefined1 (*) [32])((long)&(paVar1->cached_output).data_instance + 0x10) = ZEXT1632(auVar2);
  sVar3 = (storage_heap)ZEXT1632(auVar2);
  *(storage_heap *)((long)&(paVar1->cached_output).data_instance + 0x24) = sVar3;
  *(storage_heap *)((long)&(paVar1->grad_final).super_tensor + 8) = sVar3;
  *(longlong *)((long)&(paVar1->grad_final).super_tensor + 0x28) = 0;
  (paVar1->grad_final).data_instance.data_size = 0;
  (paVar1->cached_output)._annotation.storage = sVar3;
  paVar1->cached_output_ptr = (tensor *)0x0;
  (paVar1->grad_final).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  *(undefined4 *)((long)&(paVar1->grad_final).data_instance + 8) = 0x101;
  *(storage_heap *)((long)&(paVar1->grad_final).data_instance + 0x10) = sVar3;
  sVar3 = (storage_heap)ZEXT1632(auVar2);
  *(storage_heap *)((long)&(paVar1->grad_final).data_instance + 0x24) = sVar3;
  (paVar1->grad_final)._annotation.storage = sVar3;
  paVar1->gradient_input_is_stale = true;
  paVar1->_sample_expansion_factor = 0;
  (this->subnetwork)._M_t.
  super___uniq_ptr_impl<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
  .super__Head_base<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_false>.
  _M_head_impl = paVar1;
  this->this_layer_setup_called = false;
  this->gradient_input_is_stale = true;
  this->get_output_and_gradient_input_disabled = false;
  (this->x_grad).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->x_grad).super_tensor.m_k = (longlong)sVar3.del;
  (this->x_grad).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->x_grad).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->x_grad).super_tensor.m_size = 0;
  (this->x_grad).data_instance.data_size = 0;
  (this->x_grad).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  (this->x_grad).data_instance.host_current = true;
  (this->x_grad).data_instance.device_current = true;
  (this->x_grad).data_instance.have_active_transfer = false;
  (this->x_grad).data_instance.device_in_use = false;
  (this->x_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.ptr;
  (this->x_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->x_grad).data_instance.data_device.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.copy;
  (this->x_grad).data_instance.data_device.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  *(storage_heap *)
   ((long)&(this->x_grad).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->x_grad)._annotation.storage = sVar3;
  (this->cached_output).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->cached_output).super_tensor.m_k = (longlong)sVar3.del;
  (this->cached_output).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->cached_output).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->cached_output).super_tensor.m_size = 0;
  (this->cached_output).data_instance.data_size = 0;
  (this->cached_output).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  (this->cached_output).data_instance.host_current = true;
  (this->cached_output).data_instance.device_current = true;
  (this->cached_output).data_instance.have_active_transfer = false;
  (this->cached_output).data_instance.device_in_use = false;
  (this->cached_output).data_instance.data_host.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.ptr;
  (this->cached_output).data_instance.data_host.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->cached_output).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->cached_output).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  sVar3 = (storage_heap)ZEXT1632(auVar2);
  *(storage_heap *)
   ((long)&(this->cached_output).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->cached_output)._annotation.storage = sVar3;
  (this->params_grad).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->params_grad).super_tensor.m_k = (longlong)sVar3.del;
  (this->params_grad).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->params_grad).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->params_grad).super_tensor.m_size = 0;
  (this->params_grad).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  (this->params_grad).data_instance.data_size = 0;
  (this->params_grad).data_instance.host_current = true;
  (this->params_grad).data_instance.device_current = true;
  (this->params_grad).data_instance.have_active_transfer = false;
  (this->params_grad).data_instance.device_in_use = false;
  (this->params_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.ptr;
  (this->params_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->params_grad).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->params_grad).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  *(storage_heap *)
   ((long)&(this->params_grad).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->params_grad)._annotation.storage = sVar3;
  (this->temp_tensor).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->temp_tensor).super_tensor.m_k = (longlong)sVar3.del;
  (this->temp_tensor).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->temp_tensor).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->temp_tensor).super_tensor.m_size = 0;
  (this->temp_tensor).data_instance.data_size = 0;
  (this->temp_tensor).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  (this->temp_tensor).data_instance.host_current = true;
  (this->temp_tensor).data_instance.device_current = true;
  (this->temp_tensor).data_instance.have_active_transfer = false;
  (this->temp_tensor).data_instance.device_in_use = false;
  (this->temp_tensor).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.ptr;
  (this->temp_tensor).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->temp_tensor).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->temp_tensor).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  *(storage_heap *)
   ((long)&(this->temp_tensor).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->temp_tensor)._annotation.storage = sVar3;
  return;
}

Assistant:

add_layer(
        ):
            subnetwork(new subnet_type()),
            this_layer_setup_called(false),
            gradient_input_is_stale(true),
            get_output_and_gradient_input_disabled(false)
        {
            if (this_layer_operates_inplace())
                subnetwork->disable_output_and_gradient_getters();
        }